

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool are_equal(string_view lhs,string_view rhs)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  
  if (rhs._M_len == lhs._M_len) {
    sVar3 = 0;
    do {
      bVar4 = rhs._M_len == sVar3;
      if (bVar4) {
        return bVar4;
      }
      iVar1 = tolower((int)lhs._M_str[sVar3]);
      iVar2 = tolower((int)rhs._M_str[sVar3]);
      sVar3 = sVar3 + 1;
    } while (iVar1 == iVar2);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

constexpr bool
are_equal(const std::string_view lhs, const std::string_view rhs) noexcept
{
    if (rhs.size() != lhs.size())
        return false;

    std::string_view::size_type i = 0;
    std::string_view::size_type e = lhs.size();

    for (; i != e; ++i)
        if (std::tolower(lhs[i]) != std::tolower(rhs[i]))
            return false;

    return true;
}